

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O3

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ulong uVar8;
  float *pfVar9;
  uint uVar10;
  float *pfVar11;
  float *pfVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  
  uVar1 = a->c;
  uVar10 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,(Allocator *)opt);
  iVar13 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar1) {
      uVar8 = 0;
      do {
        pfVar9 = (float *)(a->cstep * uVar8 * a->elemsize + (long)a->data);
        pfVar11 = (float *)(b->cstep * uVar8 * b->elemsize + (long)b->data);
        pfVar12 = (float *)(c->cstep * uVar8 * c->elemsize + (long)c->data);
        if ((int)uVar10 < 4) {
          uVar14 = 0;
        }
        else {
          iVar13 = 3;
          do {
            fVar2 = pfVar11[1];
            fVar3 = pfVar11[2];
            fVar4 = pfVar11[3];
            fVar5 = pfVar9[1];
            fVar6 = pfVar9[2];
            fVar7 = pfVar9[3];
            *pfVar12 = *pfVar11 + *pfVar9;
            pfVar12[1] = fVar2 + fVar5;
            pfVar12[2] = fVar3 + fVar6;
            pfVar12[3] = fVar4 + fVar7;
            pfVar9 = pfVar9 + 4;
            pfVar11 = pfVar11 + 4;
            pfVar12 = pfVar12 + 4;
            iVar13 = iVar13 + 4;
            uVar14 = uVar10 & 0xfffffffc;
          } while (iVar13 < (int)uVar10);
        }
        if (uVar10 - uVar14 != 0 && (int)uVar14 <= (int)uVar10) {
          lVar15 = 0;
          do {
            pfVar12[lVar15] = pfVar11[lVar15] + pfVar9[lVar15];
            lVar15 = lVar15 + 1;
          } while (uVar10 - uVar14 != (int)lVar15);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar1);
    }
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}